

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

double expected_avg_depth<double>(double approx_sample_size)

{
  double dVar1;
  double dVar2;
  
  dVar1 = 0.0;
  if (1.0 < approx_sample_size) {
    if (2147483647.0 <= approx_sample_size) {
      dVar2 = 1.0 / (approx_sample_size * approx_sample_size);
      dVar1 = log(approx_sample_size);
      dVar1 = (dVar1 + dVar1 + -0.8455686701969343 + 1.0 / approx_sample_size) -
              (0.16666666666666666 - (dVar2 * -0.007936507936507936 + 0.016666666666666666) * dVar2)
              * dVar2;
    }
    else {
      dVar1 = digamma(approx_sample_size + 1.0);
      dVar1 = dVar1 + 0.5772156649015329 + -1.0;
      dVar1 = dVar1 + dVar1;
    }
  }
  return dVar1;
}

Assistant:

double expected_avg_depth(ldouble_safe approx_sample_size)
{
    if (approx_sample_size <= 1)
        return 0;
    else if (approx_sample_size < (ldouble_safe)INT32_MAX)
        return 2. * (digamma(approx_sample_size + 1.) + EULERS_GAMMA - 1.);
    else {
        ldouble_safe temp = (ldouble_safe)1 / square(approx_sample_size);
        return (ldouble_safe)2 * std::log(approx_sample_size) + (ldouble_safe)2*((ldouble_safe)EULERS_GAMMA - (ldouble_safe)1)
               + ((ldouble_safe)1/approx_sample_size)
               - temp * ( (ldouble_safe)1/(ldouble_safe)6 -   temp * ((ldouble_safe)1/(ldouble_safe)60 - ((ldouble_safe)1/(ldouble_safe)126)*temp) );
    }
}